

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O1

string * duckdb::KeywordHelper::WriteOptionallyQuoted
                   (string *__return_storage_ptr__,string *text,char quote,bool allow_caps)

{
  pointer pcVar1;
  bool bVar2;
  
  bVar2 = RequiresQuotes(text,allow_caps);
  if (bVar2) {
    WriteQuoted(__return_storage_ptr__,text,quote);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (text->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + text->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string KeywordHelper::WriteOptionallyQuoted(const string &text, char quote, bool allow_caps) {
	if (!RequiresQuotes(text, allow_caps)) {
		return text;
	}
	return WriteQuoted(text, quote);
}